

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * parse_literal_expression(gravity_parser_t *parser)

{
  gravity_delegate_t *pgVar1;
  long lVar2;
  double d;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  gtoken_s token_03;
  gtoken_s token_04;
  gtoken_s token_05;
  gtoken_s token_06;
  gtoken_s token_07;
  gtoken_s token_08;
  gtoken_s token_09;
  gtoken_s token_10;
  gnode_n tag;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  gtoken_t gVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  gbuiltin_t gVar9;
  undefined8 uVar10;
  gtoken_t token_11;
  uint32_t uVar11;
  int iVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  ulong uVar16;
  gravity_lexer_t *pgVar17;
  gravity_lexer_t **ppgVar18;
  gnode_t **ppgVar19;
  gnode_t *pgVar20;
  gnode_t *pgVar21;
  __int32_t **pp_Var22;
  ulong uVar23;
  char cVar24;
  size_t i;
  lexer_r *plVar25;
  ulong uVar26;
  size_t sVar27;
  _Bool allocated;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  uint32_t uVar31;
  size_t sVar32;
  uint uVar33;
  uint32_t uVar34;
  uint32_t i_1;
  bool bVar35;
  gnode_r *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  uint32_t len;
  gtoken_s token;
  char b [3];
  char cStack_235;
  char cStack_234;
  char cStack_233;
  char cStack_232;
  char cStack_231;
  
  pgVar17 = parser->lexer->p[parser->lexer->n - 1];
  token_11 = gravity_lexer_next(pgVar17);
  gravity_lexer_token(pgVar17);
  pcVar13 = token.value;
  gVar9 = token.builtin;
  uVar8 = token.fileid;
  uVar7 = token.length;
  uVar11 = token.bytes;
  uVar34 = token.position;
  uVar31 = token.colno;
  uVar4 = token.lineno;
  gVar6 = token.type;
  if (token_11 != TOK_STRING) {
    if (token_11 - TOK_KEY_TRUE < 2) {
      sVar27 = parser->declarations->n;
      if (sVar27 == 0) {
        pgVar21 = (gnode_t *)0x0;
      }
      else {
        pgVar21 = parser->declarations->p[sVar27 - 1];
      }
      token_03.lineno = token.lineno;
      token_03.type = token.type;
      token_03.colno = token.colno;
      token_03.position = token.position;
      token_03.bytes = token.bytes;
      token_03.length = token.length;
      token_03.fileid = token.fileid;
      token_03.builtin = token.builtin;
      token_03.value = token.value;
      pgVar21 = gnode_literal_bool_expr_create(token_03,(uint)(token_11 == TOK_KEY_TRUE),pgVar21);
      return pgVar21;
    }
    if (token_11 != TOK_NUMBER) {
      pcVar13 = token_name(token_11);
      report_error(parser,GRAVITY_ERROR_SYNTAX,0x14038a,pcVar13);
      return (gnode_t *)0x0;
    }
    uVar28 = token.colno;
    if ((token.builtin == BUILTIN_COLUMN) || (uVar28 = token.lineno, token.builtin == BUILTIN_LINE))
    {
      uVar23 = (ulong)uVar28;
      sVar27 = parser->declarations->n;
      if (sVar27 == 0) {
        pgVar21 = (gnode_t *)0x0;
      }
      else {
        pgVar21 = parser->declarations->p[sVar27 - 1];
      }
      goto LAB_00117a71;
    }
    if (*token.value == '0') {
      pp_Var22 = __ctype_toupper_loc();
      iVar12 = (*pp_Var22)[pcVar13[1]];
      if (iVar12 == 0x58) {
        uVar23 = 0;
        memset(b,0,0x200);
        len = 0;
        token_09.lineno = token.lineno;
        token_09.type = token.type;
        token_09.colno = token.colno;
        token_09.position = token.position;
        token_09.bytes = token.bytes;
        token_09.length = token.length;
        token_09.fileid = token.fileid;
        token_09.builtin = token.builtin;
        token_09.value = token.value;
        pcVar15 = token_string(token_09,&len);
        if (len != 0) {
          uVar28 = 0x200;
          if (len < 0x200) {
            uVar28 = len;
          }
          memcpy(b,pcVar15,(ulong)uVar28);
          uVar23 = number_from_hex(b,uVar11);
        }
      }
      else if (iVar12 == 0x4f) {
        uVar23 = 0;
        memset(b,0,0x200);
        len = 0;
        token_08.lineno = token.lineno;
        token_08.type = token.type;
        token_08.colno = token.colno;
        token_08.position = token.position;
        token_08.bytes = token.bytes;
        token_08.length = token.length;
        token_08.fileid = token.fileid;
        token_08.builtin = token.builtin;
        token_08.value = token.value;
        pcVar15 = token_string(token_08,&len);
        uVar5 = len;
        if (len != 0) {
          uVar28 = 0x200;
          if (len < 0x200) {
            uVar28 = len;
          }
          memcpy(b,pcVar15,(ulong)uVar28);
          uVar23 = number_from_oct(b + 2,uVar5 - 2);
        }
      }
      else {
        if (iVar12 != 0x42) goto LAB_001177b9;
        uVar23 = number_from_bin(pcVar13 + 2,uVar11 - 2);
      }
    }
    else {
LAB_001177b9:
      uVar23 = (ulong)uVar11;
      for (uVar29 = 0;
          ((uVar26 = uVar23, uVar23 != uVar29 && (uVar26 = uVar29, pcVar13[uVar29] != '.')) &&
          (pcVar13[uVar29] != 'e')); uVar29 = uVar29 + 1) {
      }
      memset(b,0,0x200);
      len = 0;
      token_06.lineno = token.lineno;
      token_06.type = token.type;
      token_06.colno = token.colno;
      token_06.position = token.position;
      token_06.bytes = token.bytes;
      token_06.length = token.length;
      token_06.fileid = token.fileid;
      token_06.builtin = token.builtin;
      token_06.value = token.value;
      pcVar15 = token_string(token_06,&len);
      uVar5 = len;
      if (len != 0) {
        sVar14 = 0x200;
        if (len < 0x200) {
          sVar14 = (size_t)len;
        }
        memcpy(b,pcVar15,sVar14);
        if (0x1ff < uVar5) {
          report_error(parser,GRAVITY_ERROR_SYNTAX,0x1403e3);
          return (gnode_t *)0x0;
        }
      }
      if (uVar26 < uVar23) {
        pgVar21 = (gnode_t *)0x0;
        d = strtod(b,(char **)0x0);
        sVar27 = parser->declarations->n;
        if (sVar27 != 0) {
          pgVar21 = parser->declarations->p[sVar27 - 1];
        }
        token_07.lineno = uVar4;
        token_07.type = gVar6;
        token_07.colno = uVar31;
        token_07.position = uVar34;
        token_07.bytes = uVar11;
        token_07.length = uVar7;
        token_07.fileid = uVar8;
        token_07.builtin = gVar9;
        token_07.value = pcVar13;
        pgVar21 = gnode_literal_float_expr_create(token_07,d,pgVar21);
        return pgVar21;
      }
      uVar23 = strtoll(b,(char **)0x0,0);
    }
    sVar27 = parser->declarations->n;
    if (sVar27 == 0) {
      pgVar21 = (gnode_t *)0x0;
    }
    else {
      pgVar21 = parser->declarations->p[sVar27 - 1];
    }
LAB_00117a71:
    token_10.lineno = uVar4;
    token_10.type = gVar6;
    token_10.colno = uVar31;
    token_10.position = uVar34;
    token_10.bytes = uVar11;
    token_10.length = uVar7;
    token_10.fileid = uVar8;
    token_10.builtin = gVar9;
    token_10.value = pcVar13;
    pgVar21 = gnode_literal_int_expr_create(token_10,uVar23,pgVar21);
    return pgVar21;
  }
  len = 0;
  token_00.lineno = token.lineno;
  token_00.type = token.type;
  token_00.colno = token.colno;
  token_00.position = token.position;
  token_00.bytes = token.bytes;
  token_00.length = token.length;
  token_00.fileid = token.fileid;
  token_00.builtin = token.builtin;
  token_00.value = token.value;
  pcVar13 = token_string(token_00,&len);
  uVar4 = len;
  uVar23 = (ulong)len;
  local_2a8 = CONCAT44(token.length,token.bytes);
  uStack_2a0 = CONCAT44(token.builtin,token.fileid);
  local_2b8 = CONCAT44(token.lineno,token.type);
  uStack_2b0 = CONCAT44(token.position,token.colno);
  if (token.builtin == BUILTIN_CLASS) {
    tag = NODE_CLASS_DECL;
LAB_001174f7:
    pgVar21 = get_enclosing(parser,tag);
    if (pgVar21 == (gnode_t *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar13 = *(char **)&pgVar21[1].token.colno;
      pcVar15 = "";
      if (pcVar13 != (char *)0x0) {
        pcVar15 = pcVar13;
      }
    }
    sVar14 = strlen(pcVar15);
    uVar31 = (uint32_t)sVar14;
    sVar27 = parser->declarations->n;
    if (sVar27 == 0) {
      pgVar21 = (gnode_t *)0x0;
    }
    else {
      pgVar21 = parser->declarations->p[sVar27 - 1];
    }
  }
  else {
    if (token.builtin == BUILTIN_FUNC) {
      tag = NODE_FUNCTION_DECL;
      goto LAB_001174f7;
    }
    if (((token.builtin != BUILTIN_FILE) ||
        (pgVar1 = parser->delegate, pgVar1 == (gravity_delegate_t *)0x0)) ||
       (pgVar1->filename_callback == (gravity_filename_callback)0x0)) {
      uVar28 = len + 1;
      pcVar15 = (char *)gravity_calloc((gravity_vm *)0x0,1,(ulong)uVar28);
      uVar34 = 0;
      local_2c0 = (gnode_r *)0x0;
LAB_00116fb5:
      uVar29 = 0;
LAB_00116fba:
      uVar10 = _b;
      uVar31 = (uint32_t)uVar29;
      if (uVar4 <= uVar34) goto LAB_00117623;
      uVar26 = (ulong)uVar34;
      cVar24 = pcVar13[uVar26];
      if (cVar24 != '\\') {
LAB_00117039:
        uVar16 = (ulong)uVar34;
        goto LAB_0011703b;
      }
      uVar16 = uVar26 + 1;
      if (uVar4 <= (uint)uVar16) goto LAB_001175e5;
      cVar24 = pcVar13[uVar16];
      switch(cVar24) {
      case 'n':
        cVar24 = '\n';
        break;
      case 'o':
      case 'p':
      case 'q':
      case 's':
      case 'w':
switchD_00117031_caseD_6f:
        cVar24 = '\\';
        goto LAB_00117039;
      case 'r':
        cVar24 = '\r';
        break;
      case 't':
        cVar24 = '\t';
        break;
      case 'u':
        if (uVar4 <= uVar34 + 5) goto LAB_001175e5;
        b._0_2_ = CONCAT11(pcVar13[uVar34 + 3],pcVar13[uVar26 + 2]);
        b = (char  [3])CONCAT12(pcVar13[uVar34 + 4],b._0_2_);
        _b = CONCAT13(pcVar13[uVar34 + 5],b);
        _cStack_233 = SUB83(uVar10,5);
        _b = (uint5)_b;
        uVar26 = strtoul(b,(char **)0x0,0x10);
        uVar11 = utf8_encode(pcVar15 + uVar29,(uint32_t)uVar26);
        uVar29 = (ulong)(uVar31 + uVar11);
        uVar34 = uVar34 + 6;
        goto LAB_00116fba;
      case 'v':
        cVar24 = '\v';
        break;
      case 'x':
        if (uVar4 <= uVar34 + 3) {
LAB_001175e5:
          pcVar13 = "Unexpected EOF inside a string literal";
          goto LAB_001175f1;
        }
        b._0_2_ = CONCAT11(pcVar13[uVar34 + 3],pcVar13[uVar26 + 2]);
        b = (char  [3])CONCAT12('\0',b._0_2_);
        uVar26 = strtoul(b,(char **)0x0,0x10);
        pcVar15[uVar29] = (char)uVar26;
        uVar34 = uVar34 + 4;
        uVar29 = (ulong)(uVar31 + 1);
        goto LAB_00116fba;
      default:
        if ((cVar24 == '\"') || (cVar24 == '\'')) break;
        if (cVar24 == 'U') {
          if (uVar4 <= uVar34 + 9) goto LAB_001175e5;
          b._0_2_ = CONCAT11(pcVar13[uVar34 + 3],pcVar13[uVar26 + 2]);
          b = (char  [3])CONCAT12(pcVar13[uVar34 + 4],b._0_2_);
          _b = CONCAT13(pcVar13[uVar34 + 5],b);
          _b = CONCAT14(pcVar13[uVar34 + 6],_b);
          _b = CONCAT17(pcVar13[uVar34 + 9],
                        CONCAT16(pcVar13[uVar34 + 8],CONCAT15(pcVar13[uVar34 + 7],_b)));
          uVar26 = strtoul(b,(char **)0x0,0x10);
          uVar11 = utf8_encode(pcVar15 + uVar29,(uint32_t)uVar26);
          uVar29 = (ulong)(uVar31 + uVar11);
          uVar34 = uVar34 + 10;
          goto LAB_00116fba;
        }
        if (cVar24 == '\\') break;
        if (cVar24 == 'a') {
          cVar24 = '\a';
          break;
        }
        if (cVar24 == 'b') {
          cVar24 = '\b';
          break;
        }
        if (cVar24 == 'f') {
          cVar24 = '\f';
          break;
        }
        if (cVar24 != '(') goto switchD_00117031_caseD_6f;
        uVar30 = uVar34 + 2;
        iVar12 = 0;
        bVar3 = false;
        uVar29 = (ulong)uVar30;
        uVar33 = uVar30;
        do {
          uVar34 = uVar4;
          if (uVar23 <= uVar29) break;
          if (pcVar13[uVar29] == '(') {
            iVar12 = iVar12 + 1;
          }
          else if ((pcVar13[uVar29] == ')') && (bVar35 = iVar12 == 0, iVar12 = iVar12 + -1, bVar35))
          {
            iVar12 = 0;
            bVar3 = true;
          }
          uVar29 = uVar29 + 1;
          uVar34 = uVar33 + 1;
          uVar33 = uVar34;
        } while (!bVar3);
        if ((bVar3) && (iVar12 == 0)) {
          pgVar17 = gravity_lexer_create(pcVar13 + uVar30,(ulong)(uVar34 - uVar30),0,true);
          plVar25 = parser->lexer;
          sVar27 = plVar25->n;
          if (sVar27 == plVar25->m) {
            sVar32 = sVar27 * 2;
            if (sVar27 == 0) {
              sVar32 = 8;
            }
            plVar25->m = sVar32;
            ppgVar18 = (gravity_lexer_t **)realloc(plVar25->p,sVar32 << 3);
            plVar25 = parser->lexer;
            plVar25->p = ppgVar18;
            sVar27 = plVar25->n;
          }
          else {
            ppgVar18 = plVar25->p;
          }
          plVar25->n = sVar27 + 1;
          ppgVar18[sVar27] = pgVar17;
          pgVar21 = parse_expression(parser);
          if (pgVar21 != (gnode_t *)0x0) {
            _b = local_2b8;
            (pgVar21->token).bytes = token.bytes;
            (pgVar21->token).length = token.length;
            (pgVar21->token).fileid = token.fileid;
            (pgVar21->token).builtin = token.builtin;
            (pgVar21->token).value = token.value;
            (pgVar21->token).type = token.type;
            (pgVar21->token).lineno = token.lineno;
            (pgVar21->token).colno = token.colno;
            (pgVar21->token).position = token.position;
            if (pgVar21->tag == NODE_POSTFIX_EXPR) {
              lVar2 = *(long *)(pgVar21 + 1);
              if (lVar2 != 0) {
                *(char **)(lVar2 + 0x30) = token.value;
                *(undefined8 *)(lVar2 + 0x20) = local_2a8;
                *(undefined8 *)(lVar2 + 0x28) = uStack_2a0;
                *(undefined8 *)(lVar2 + 0x10) = local_2b8;
                *(undefined8 *)(lVar2 + 0x18) = uStack_2b0;
              }
              if (*(ulong **)&pgVar21[1].block_length == (ulong *)0x0) {
                uVar29 = 0;
              }
              else {
                uVar29 = **(ulong **)&pgVar21[1].block_length;
              }
              for (uVar26 = 0; uVar29 != uVar26; uVar26 = uVar26 + 1) {
                if ((uVar26 < **(ulong **)&pgVar21[1].block_length) &&
                   (lVar2 = *(long *)((*(ulong **)&pgVar21[1].block_length)[2] + uVar26 * 8),
                   lVar2 != 0)) {
                  *(char **)(lVar2 + 0x30) = token.value;
                  *(undefined8 *)(lVar2 + 0x20) = local_2a8;
                  *(undefined8 *)(lVar2 + 0x28) = uStack_2a0;
                  *(undefined8 *)(lVar2 + 0x10) = local_2b8;
                  *(undefined8 *)(lVar2 + 0x18) = uStack_2b0;
                }
              }
            }
            if (local_2c0 == (gnode_r *)0x0) {
              local_2c0 = gnode_array_create();
            }
            sVar27 = local_2c0->n;
            if (uVar31 != 0) {
              if (sVar27 == local_2c0->m) {
                sVar32 = sVar27 * 2;
                if (sVar27 == 0) {
                  sVar32 = 8;
                }
                local_2c0->m = sVar32;
                ppgVar19 = (gnode_t **)realloc(local_2c0->p,sVar32 << 3);
                local_2c0->p = ppgVar19;
              }
              sVar27 = parser->declarations->n;
              if (sVar27 == 0) {
                pgVar20 = (gnode_t *)0x0;
              }
              else {
                pgVar20 = parser->declarations->p[sVar27 - 1];
              }
              token_01.colno = token.colno;
              token_01.type = token.type;
              token_01.lineno = token.lineno;
              token_01.position = token.position;
              token_01.bytes = token.bytes;
              token_01.length = token.length;
              token_01.fileid = token.fileid;
              token_01.builtin = token.builtin;
              token_01.value = token.value;
              pgVar20 = gnode_literal_string_expr_create(token_01,pcVar15,uVar31,true,pgVar20);
              sVar32 = local_2c0->n;
              sVar27 = sVar32 + 1;
              local_2c0->n = sVar27;
              local_2c0->p[sVar32] = pgVar20;
            }
            if (sVar27 == local_2c0->m) {
              sVar32 = sVar27 * 2;
              if (sVar27 == 0) {
                sVar32 = 8;
              }
              local_2c0->m = sVar32;
              ppgVar19 = (gnode_t **)realloc(local_2c0->p,sVar32 << 3);
              local_2c0->p = ppgVar19;
              sVar27 = local_2c0->n;
            }
            else {
              ppgVar19 = local_2c0->p;
            }
            local_2c0->n = sVar27 + 1;
            ppgVar19[sVar27] = pgVar21;
          }
          parser->lexer->n = parser->lexer->n - 1;
          gravity_lexer_free(pgVar17);
          if (pgVar21 != (gnode_t *)0x0) goto code_r0x001174be;
        }
        else {
          pcVar13 = "Malformed interpolation string not closed by )";
LAB_001175f1:
          report_error(parser,GRAVITY_ERROR_SYNTAX,pcVar13);
        }
LAB_00117623:
        if ((local_2c0 != (gnode_r *)0x0) && (uVar31 != 0)) {
          sVar27 = local_2c0->n;
          if (sVar27 == local_2c0->m) {
            sVar32 = sVar27 * 2;
            if (sVar27 == 0) {
              sVar32 = 8;
            }
            local_2c0->m = sVar32;
            ppgVar19 = (gnode_t **)realloc(local_2c0->p,sVar32 << 3);
            local_2c0->p = ppgVar19;
          }
          sVar27 = parser->declarations->n;
          if (sVar27 == 0) {
            pgVar21 = (gnode_t *)0x0;
          }
          else {
            pgVar21 = parser->declarations->p[sVar27 - 1];
          }
          token_04.colno = token.colno;
          token_04.type = token.type;
          token_04.lineno = token.lineno;
          token_04.position = token.position;
          token_04.bytes = token.bytes;
          token_04.length = token.length;
          token_04.fileid = token.fileid;
          token_04.builtin = token.builtin;
          token_04.value = token.value;
          pgVar21 = gnode_literal_string_expr_create(token_04,pcVar15,uVar31,true,pgVar21);
          sVar27 = local_2c0->n;
          local_2c0->n = sVar27 + 1;
          local_2c0->p[sVar27] = pgVar21;
LAB_0011774f:
          sVar27 = parser->declarations->n;
          if (sVar27 == 0) {
            pgVar21 = (gnode_t *)0x0;
          }
          else {
            pgVar21 = parser->declarations->p[sVar27 - 1];
          }
          token_05.colno = token.colno;
          token_05.type = token.type;
          token_05.lineno = token.lineno;
          token_05.position = token.position;
          token_05.bytes = token.bytes;
          token_05.length = token.length;
          token_05.fileid = token.fileid;
          token_05.builtin = token.builtin;
          token_05.value = token.value;
          pgVar21 = gnode_string_interpolation_create(token_05,local_2c0,pgVar21);
          return pgVar21;
        }
        if (local_2c0 != (gnode_r *)0x0) goto LAB_0011774f;
        sVar27 = parser->declarations->n;
        if (sVar27 == 0) {
          pgVar21 = (gnode_t *)0x0;
        }
        else {
          pgVar21 = parser->declarations->p[sVar27 - 1];
        }
        allocated = true;
        goto LAB_001175af;
      }
LAB_0011703b:
      pcVar15[uVar29] = cVar24;
      uVar34 = (int)uVar16 + 1;
      uVar29 = (ulong)(uVar31 + 1);
      goto LAB_00116fba;
    }
    pcVar13 = (*pgVar1->filename_callback)(token.fileid,pgVar1->xdata);
    pcVar15 = "";
    if (pcVar13 != (char *)0x0) {
      pcVar15 = pcVar13;
    }
    sVar14 = strlen(pcVar15);
    uVar31 = (uint32_t)sVar14;
    sVar27 = parser->declarations->n;
    if (sVar27 == 0) {
      pgVar21 = (gnode_t *)0x0;
    }
    else {
      pgVar21 = parser->declarations->p[sVar27 - 1];
    }
  }
  allocated = false;
LAB_001175af:
  token_02.lineno = token.lineno;
  token_02.type = token.type;
  token_02.colno = token.colno;
  token_02.position = token.position;
  token_02.bytes = token.bytes;
  token_02.length = token.length;
  token_02.fileid = token.fileid;
  token_02.builtin = token.builtin;
  token_02.value = token.value;
  pgVar21 = gnode_literal_string_expr_create(token_02,pcVar15,uVar31,allocated,pgVar21);
  return pgVar21;
code_r0x001174be:
  pcVar15 = (char *)gravity_calloc((gravity_vm *)0x0,1,(ulong)uVar28);
  goto LAB_00116fb5;
}

Assistant:

gnode_t *parse_literal_expression (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_literal_expression");
    DECLARE_LEXER;

    gtoken_t type = gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);

    if (type == TOK_STRING) {
        uint32_t len = 0;
        const char *value = token_string(token, &len);
        DEBUG_PARSER("STRING: %.*s", len, value);
        // run string analyzer because string is returned as is from the lexer
        // but string can contains escaping sequences and interpolations that
        // need to be processed
        return parse_analyze_literal_string(parser, token, value, len);
    }

    if (type == TOK_KEY_TRUE || type == TOK_KEY_FALSE) {
        return gnode_literal_bool_expr_create(token, (int32_t)(type == TOK_KEY_TRUE) ? 1 : 0, LAST_DECLARATION());
    }

    if (type != TOK_NUMBER) {
        REPORT_ERROR(token, "Expected literal expression but found %s.", token_name(type));
        return NULL;
    }

    return parse_number_expression(parser, token);
}